

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

void __thiscall
CGL::GLScene::Sphere::Sphere(Sphere *this,SphereInfo *info,Vector3D *position,double scale)

{
  BSDF *pBVar1;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_002a9260;
  this->r = (double)info->radius * scale;
  (this->p).field_0.field_0.x = (position->field_0).field_0.x;
  (this->p).field_0.field_0.y = (position->field_0).field_0.y;
  (this->p).field_0.field_0.z = (position->field_0).field_0.z;
  if (info->material == (MaterialInfo *)0x0) {
    pBVar1 = (BSDF *)operator_new(0x50);
    pBVar1->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar1[1].reflectanceMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar1[1].normalMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar1[2]._vptr_BSDF = (_func_int **)0x3fe0000000000000;
    pBVar1[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_002a9430;
  }
  else {
    pBVar1 = info->material->bsdf;
  }
  this->bsdf = pBVar1;
  return;
}

Assistant:

Sphere::Sphere(const Collada::SphereInfo& info, 
               const Vector3D position, const double scale) : 
  p(position), r(info.radius * scale) { 
  if (info.material) {
    bsdf = info.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Vector3D(0.5f,0.5f,0.5f));    
  }
}